

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void ImGui::PopItemFlag(void)

{
  ImGuiWindow *pIVar1;
  int iVar2;
  int iVar3;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  iVar2 = (pIVar1->DC).ItemFlagsStack.Size;
  iVar3 = iVar2 + -1;
  (pIVar1->DC).ItemFlagsStack.Size = iVar3;
  if (iVar3 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = (pIVar1->DC).ItemFlagsStack.Data[(long)iVar2 + -2];
  }
  (pIVar1->DC).ItemFlags = iVar2;
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }